

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

Id dxil_spv::emit_query_size(Impl *impl,Id image_id,bool array,Id lod_id)

{
  Id IVar1;
  Id type_id;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  undefined7 in_register_00000011;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeIntType(this,0x20);
  type_id = spv::Builder::makeVectorType(this,IVar1,(int)CONCAT71(in_register_00000011,array) + 2);
  this_00 = Converter::Impl::allocate(impl,(lod_id == 0) + OpImageQuerySizeLod,type_id);
  Operation::add_id(this_00,image_id);
  if (lod_id != 0) {
    Operation::add_id(this_00,lod_id);
  }
  Converter::Impl::add(impl,this_00,false);
  this_01 = this_00;
  if (array) {
    IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
    this_01 = Converter::Impl::allocate(impl,OpVectorShuffle,IVar1);
    Operation::add_id(this_01,this_00->id);
    Operation::add_id(this_01,this_00->id);
    Operation::add_literal(this_01,0);
    Operation::add_literal(this_01,1);
    Converter::Impl::add(impl,this_01,false);
  }
  return this_01->id;
}

Assistant:

static spv::Id emit_query_size(Converter::Impl &impl, spv::Id image_id,
                               bool array, spv::Id lod_id = 0)
{
	auto &builder = impl.builder();
	spv::Id i32_type = builder.makeIntType(32);

	auto *query_size_level_zero = impl.allocate(
		lod_id ? spv::OpImageQuerySizeLod : spv::OpImageQuerySize,
		builder.makeVectorType(i32_type, array ? 3 : 2));
	query_size_level_zero->add_id(image_id);
	if (lod_id)
		query_size_level_zero->add_id(lod_id);
	impl.add(query_size_level_zero);

	if (array)
	{
		auto *extract = impl.allocate(spv::OpVectorShuffle, builder.makeVectorType(i32_type, 2));
		extract->add_id(query_size_level_zero->id);
		extract->add_id(query_size_level_zero->id);
		extract->add_literal(0);
		extract->add_literal(1);
		impl.add(extract);

		query_size_level_zero = extract;
	}

	return query_size_level_zero->id;
}